

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O3

bool __thiscall GT7VolumeFile::parseExtendedHeader(GT7VolumeFile *this,StreamDesc *streamDesc)

{
  uint uVar1;
  pointer puVar2;
  long *plVar3;
  bool bVar4;
  
  puVar2 = (streamDesc->extHeader).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((streamDesc->extHeader).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (streamDesc->extHeader).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  bVar4 = false;
  VolumeFile::readDataAt(&this->super_VolumeFile,&streamDesc->stream,&streamDesc->extHeader,0,0x20);
  plVar3 = (long *)(streamDesc->extHeader).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  if (*plVar3 == 0x2b26958523ad) {
    uVar1 = *(uint *)(plVar3 + 1);
    if (((uVar1 & 0x3ff) == 0 && uVar1 != 0) &&
       ((*(uint *)((long)plVar3 + 0xc) & 0x3ff) == 0 && *(uint *)((long)plVar3 + 0xc) != 0)) {
      streamDesc->sectorSize = uVar1;
      bVar4 = true;
      streamDesc->segmentSize = *(uint32_t *)((long)plVar3 + 0xc);
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool GT7VolumeFile::parseExtendedHeader(StreamDesc& streamDesc)
{
	streamDesc.extHeader.clear();

	if (!readDataAt(streamDesc.stream, streamDesc.extHeader, 0, sizeof(ExtHeader))) {
		return false;
	}

	const auto& header = *reinterpret_cast<ExtHeader*>(streamDesc.extHeader.data());
	if (header.magic != EXT_HEADER_MAGIC) {
		return false;
	}
	if (header.sectorSize == 0 || (header.sectorSize % EXT_ALIGNMENT != 0)) {
		return false;
	}
	if (header.segmentSize == 0 || (header.segmentSize % EXT_ALIGNMENT != 0)) {
		return false;
	}
	
	streamDesc.sectorSize = header.sectorSize;
	streamDesc.segmentSize = header.segmentSize;
	
	return true;
}